

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O0

int __thiscall
NoMeEdgeCalculator::pairedReadDetermination
          (NoMeEdgeCalculator *this,AlignmentRecord *ar1,AlignmentRecord *ar2)

{
  code *pcVar1;
  uint uVar2;
  uint uVar3;
  AlignmentRecord *in_RDX;
  AlignmentRecord *in_RSI;
  
  uVar2 = AlignmentRecord::getEnd1(in_RSI);
  uVar3 = AlignmentRecord::getStart2(in_RDX);
  if (uVar2 < uVar3) {
    uVar2 = AlignmentRecord::getStart2(in_RSI);
    uVar3 = AlignmentRecord::getEnd1(in_RDX);
    if (uVar3 < uVar2) {
      return 1;
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RSI);
  uVar3 = AlignmentRecord::getStart2(in_RDX);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getEnd1(in_RSI);
    uVar3 = AlignmentRecord::getStart1(in_RDX);
    if (uVar3 <= uVar2) {
      uVar2 = AlignmentRecord::getStart2(in_RSI);
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      if (uVar2 <= uVar3) {
        uVar2 = AlignmentRecord::getEnd2(in_RSI);
        uVar3 = AlignmentRecord::getStart2(in_RDX);
        if (uVar3 <= uVar2) {
          return 2;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RSI);
  uVar3 = AlignmentRecord::getStart2(in_RDX);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getEnd1(in_RSI);
    uVar3 = AlignmentRecord::getStart1(in_RDX);
    if (uVar3 <= uVar2) {
      uVar2 = AlignmentRecord::getStart2(in_RSI);
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      if (uVar2 <= uVar3) {
        uVar2 = AlignmentRecord::getEnd2(in_RSI);
        uVar3 = AlignmentRecord::getStart2(in_RDX);
        if (uVar2 < uVar3) {
          return 3;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RDX);
  uVar3 = AlignmentRecord::getStart2(in_RSI);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getEnd1(in_RSI);
    uVar3 = AlignmentRecord::getStart1(in_RDX);
    if (uVar2 < uVar3) {
      uVar2 = AlignmentRecord::getStart2(in_RSI);
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      if (uVar2 <= uVar3) {
        uVar2 = AlignmentRecord::getEnd2(in_RSI);
        uVar3 = AlignmentRecord::getStart2(in_RDX);
        if (uVar3 <= uVar2) {
          return 4;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart2(in_RSI);
  uVar3 = AlignmentRecord::getStart1(in_RDX);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getEnd1(in_RSI);
    uVar3 = AlignmentRecord::getStart1(in_RDX);
    if (uVar2 < uVar3) {
      uVar2 = AlignmentRecord::getStart2(in_RSI);
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      if (uVar2 <= uVar3) {
        uVar2 = AlignmentRecord::getEnd2(in_RSI);
        uVar3 = AlignmentRecord::getStart2(in_RDX);
        if (uVar3 <= uVar2) {
          return 5;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RSI);
  uVar3 = AlignmentRecord::getStart1(in_RDX);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getStart1(in_RSI);
    uVar3 = AlignmentRecord::getEnd1(in_RDX);
    if (uVar2 <= uVar3) {
      uVar2 = AlignmentRecord::getEnd1(in_RSI);
      uVar3 = AlignmentRecord::getStart2(in_RDX);
      if (uVar3 <= uVar2) {
        uVar2 = AlignmentRecord::getStart2(in_RSI);
        uVar3 = AlignmentRecord::getEnd2(in_RDX);
        if (uVar2 <= uVar3) {
          return 6;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RSI);
  uVar3 = AlignmentRecord::getStart1(in_RDX);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getStart2(in_RSI);
    uVar3 = AlignmentRecord::getEnd2(in_RDX);
    if (uVar3 < uVar2) {
      uVar2 = AlignmentRecord::getEnd1(in_RSI);
      uVar3 = AlignmentRecord::getStart2(in_RDX);
      if (uVar3 <= uVar2) {
        uVar2 = AlignmentRecord::getStart1(in_RSI);
        uVar3 = AlignmentRecord::getEnd1(in_RDX);
        if (uVar2 <= uVar3) {
          return 7;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RDX);
  uVar3 = AlignmentRecord::getStart1(in_RSI);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getEnd1(in_RSI);
    uVar3 = AlignmentRecord::getStart1(in_RDX);
    if (uVar3 <= uVar2) {
      uVar2 = AlignmentRecord::getStart2(in_RSI);
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      if (uVar2 <= uVar3) {
        uVar2 = AlignmentRecord::getEnd2(in_RSI);
        uVar3 = AlignmentRecord::getStart2(in_RDX);
        if (uVar3 <= uVar2) {
          return 8;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RDX);
  uVar3 = AlignmentRecord::getStart1(in_RSI);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getEnd1(in_RSI);
    uVar3 = AlignmentRecord::getStart1(in_RDX);
    if (uVar3 <= uVar2) {
      uVar2 = AlignmentRecord::getStart2(in_RSI);
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      if (uVar2 <= uVar3) {
        uVar2 = AlignmentRecord::getEnd2(in_RSI);
        uVar3 = AlignmentRecord::getStart2(in_RDX);
        if (uVar2 < uVar3) {
          return 9;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RSI);
  uVar3 = AlignmentRecord::getStart2(in_RDX);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getStart1(in_RSI);
    uVar3 = AlignmentRecord::getEnd1(in_RDX);
    if (uVar3 < uVar2) {
      uVar2 = AlignmentRecord::getEnd1(in_RSI);
      uVar3 = AlignmentRecord::getStart2(in_RDX);
      if (uVar3 <= uVar2) {
        uVar2 = AlignmentRecord::getStart2(in_RSI);
        uVar3 = AlignmentRecord::getEnd2(in_RDX);
        if (uVar2 <= uVar3) {
          return 10;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart2(in_RDX);
  uVar3 = AlignmentRecord::getStart1(in_RSI);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getEnd1(in_RDX);
    uVar3 = AlignmentRecord::getStart1(in_RSI);
    if (uVar2 < uVar3) {
      uVar2 = AlignmentRecord::getEnd1(in_RSI);
      uVar3 = AlignmentRecord::getStart2(in_RDX);
      if (uVar3 <= uVar2) {
        uVar2 = AlignmentRecord::getStart2(in_RSI);
        uVar3 = AlignmentRecord::getEnd2(in_RDX);
        if (uVar2 <= uVar3) {
          return 0xb;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RDX);
  uVar3 = AlignmentRecord::getStart1(in_RSI);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getStart1(in_RSI);
    uVar3 = AlignmentRecord::getEnd1(in_RDX);
    if (uVar2 <= uVar3) {
      uVar2 = AlignmentRecord::getEnd1(in_RSI);
      uVar3 = AlignmentRecord::getStart2(in_RDX);
      if (uVar3 <= uVar2) {
        uVar2 = AlignmentRecord::getStart2(in_RSI);
        uVar3 = AlignmentRecord::getEnd2(in_RDX);
        if (uVar2 <= uVar3) {
          return 0xc;
        }
      }
    }
  }
  uVar2 = AlignmentRecord::getStart1(in_RDX);
  uVar3 = AlignmentRecord::getStart1(in_RSI);
  if (uVar2 <= uVar3) {
    uVar2 = AlignmentRecord::getStart2(in_RSI);
    uVar3 = AlignmentRecord::getEnd2(in_RDX);
    if (uVar3 < uVar2) {
      uVar2 = AlignmentRecord::getStart1(in_RSI);
      uVar3 = AlignmentRecord::getEnd1(in_RDX);
      if (uVar2 <= uVar3) {
        uVar2 = AlignmentRecord::getEnd1(in_RSI);
        uVar3 = AlignmentRecord::getStart2(in_RDX);
        if (uVar3 <= uVar2) {
          return 0xd;
        }
      }
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int NoMeEdgeCalculator::pairedReadDetermination(const AlignmentRecord& ar1, const AlignmentRecord& ar2)const{

    // --------    |  -----------    <-ar1
    //   --------  |     ----------

    if(ar1.getEnd1() < ar2.getStart2() && ar1.getStart2() > ar2.getEnd1()){
        return 1;
    }//----------    ------------   <-ar1
    //    ---------------   -----------
    else if(ar1.getStart1() <= ar2.getStart2() && ar1.getEnd1() >= ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() >= ar2.getStart2()){
        return 2;

   } //-----------       ----------- <-ar1
    //    -----------------               -----------
    else if(ar1.getStart1() <= ar2.getStart2() && ar1.getEnd1() >=ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() < ar2.getStart2()){
        return 3;
   } //----------        ------------  <- ar1
    //                --------    ----------
    else if(ar2.getStart1() <= ar1.getStart2() && ar1.getEnd1() < ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() >= ar2.getStart2()){
        return 4;
    } //--------      --------- <-ar1
      //                --  -----------
    else if(ar1.getStart2() <= ar2.getStart1() && ar1.getEnd1() < ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() >= ar2.getStart2() ){
        return 5;
    } // -------------     ----------- <-ar1
        //   ----  ---------------
    else if(ar1.getStart1() <= ar2.getStart1() &&ar1.getStart1() <= ar2.getEnd1() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart2() <= ar2.getEnd2()){\
        return 6;
    } //----------         -----------  <-ar1
     //  ----   -------
    else if(ar1.getStart1() <= ar2.getStart1() && ar1.getStart2() > ar2.getEnd2() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart1() <= ar2.getEnd1()){
        return 7;
    } //   ------   -----------   <-ar1
    //----------------  ----------------
      else if(ar2.getStart1() <= ar1.getStart1() && ar1.getEnd1() >= ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() >= ar2.getStart2()){
        return 8;
    } //      ----    --------- <-ar1
      //------------------          --------------
      else if(ar2.getStart1() <= ar1.getStart1() && ar1.getEnd1() >= ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() < ar2.getStart2()){
        return 9;

    } //                -------    ------- <-ar1
      //-------------       ------------
      else if(ar1.getStart1() <= ar2.getStart2() && ar1.getStart1() > ar2.getEnd1() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart2() <= ar2.getEnd2()){
        return 10;
    } //                   ---   -------- <-ar1
      //-------------     -----------
     else if(ar2.getStart2() <= ar1.getStart1() && ar2.getEnd1()<ar1.getStart1() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart2() <= ar2.getEnd2()){
        return 11;
    }
       //  --------    ------------  <-ar1
       //-----    ----------------
      else if(ar2.getStart1() <= ar1.getStart1() && ar1.getStart1() <= ar2.getEnd1() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart2() <= ar2.getEnd2()){
        return 12;
    } //   --------------                 -------------- <-ar1
      //----------     -------------
      else if(ar2.getStart1() <= ar1.getStart1() && ar1.getStart2() > ar2.getEnd2() && ar1.getStart1() <= ar2.getEnd1() && ar1.getEnd1() >= ar2.getStart2()){
        return 13;
    }
}